

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.hpp
# Opt level: O2

any * __thiscall Json::operator[](Json *this,string *key)

{
  bool bVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *this_00;
  mapped_type *pmVar2;
  undefined8 *puVar3;
  
  bVar1 = is_object(this);
  if (bVar1) {
    this_00 = std::
              any_cast<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>&>
                        (&this->_data);
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
             ::operator[](this_00,key);
    return pmVar2;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__bad_cast_0014cfe0;
  __cxa_throw(puVar3,&std::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

std::any &operator[](const std::string &key) {
        if (this->is_object()) {
            auto &data =
                    std::any_cast<std::map<std::string, std::any> &>(_data);
            return data[key];
        } else {
            throw std::bad_any_cast();
        }
    }